

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O2

bool ReadDebugInfo(char *fileName,DebugInfo *to)

{
  key_type *__k;
  ushort uVar1;
  pointer pPVar2;
  size_type sVar3;
  bool bVar4;
  ErrorCode EVar5;
  uint32_t uVar6;
  int32_t iVar7;
  Record *pRVar8;
  size_t sVar9;
  SectionContrib *pSVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  char *__format;
  __node_base *p_Var14;
  __normal_iterator<PDBSymbol_*,_std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>_> __i;
  long lVar15;
  pointer pPVar16;
  long lVar17;
  Module *this;
  HashRecord *__begin1;
  undefined8 uVar18;
  size_type sVar19;
  pointer pPVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong local_328;
  vector<PDBSymbol,_std::allocator<PDBSymbol>_> rvaSortedSymbols;
  ModuleSymbolStream moduleSymbolStream;
  undefined8 local_2d0;
  ulong local_2c8;
  vector<SectionContrib,_std::allocator<SectionContrib>_> contributions;
  RVAToSymbolMap rvaToSymbol;
  CoalescedMSFStream symbolRecordStream;
  RawFile rawPdbFile;
  key_type local_1c0 [2];
  size_t local_1b8;
  ImageSectionStream imageSectionStream;
  MemoryMappedFile pdbFile;
  ModuleInfoStream moduleInfoStream;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  typeSizeCache;
  TypeTable typeTable;
  DBIStream dbiStream;
  InfoStream infoStream;
  SectionContributionStream sectionContributionStream;
  
  MemoryMappedFile::MemoryMappedFile(&pdbFile,fileName);
  if (pdbFile.baseAddress == (void *)0x0) {
    bVar4 = false;
    fprintf(_stderr,"  failed to memory-map PDB file \'%s\'\n",fileName);
    goto LAB_00108344;
  }
  EVar5 = PDB::ValidateFile(pdbFile.baseAddress);
  if (EVar5 != Success) {
    bVar4 = false;
    fprintf(_stderr,"  failed to validate PDB file \'%s\': error code %i\n",fileName,(ulong)EVar5);
    goto LAB_00108344;
  }
  PDB::CreateRawFile(&rawPdbFile,pdbFile.baseAddress);
  EVar5 = PDB::HasValidDBIStream(&rawPdbFile);
  if (EVar5 == Success) {
    PDB::InfoStream::InfoStream(&infoStream,&rawPdbFile);
    if (infoStream.m_usesDebugFastlink == true) {
      __format = "  PDB file \'%s\' uses unsupported option /DEBUG:FASTLINK\n";
LAB_0010831e:
      bVar4 = false;
      fprintf(_stderr,__format,fileName);
    }
    else {
      PDB::CreateDBIStream(&dbiStream,&rawPdbFile);
      EVar5 = PDB::DBIStream::HasValidImageSectionStream(&dbiStream,&rawPdbFile);
      if ((((EVar5 != Success) ||
           (EVar5 = PDB::DBIStream::HasValidPublicSymbolStream(&dbiStream,&rawPdbFile),
           EVar5 != Success)) ||
          (EVar5 = PDB::DBIStream::HasValidGlobalSymbolStream(&dbiStream,&rawPdbFile),
          EVar5 != Success)) ||
         (EVar5 = PDB::DBIStream::HasValidSectionContributionStream(&dbiStream,&rawPdbFile),
         EVar5 != Success)) {
        __format = "  PDB file \'%s\' does not have required DBI sections\n";
        goto LAB_0010831e;
      }
      if ((dbiStream.m_header.flags & 1) != 0) {
        puts(
            "Warning: PDB file is created with incremental linking, some information might be misleading."
            );
      }
      if ((dbiStream.m_header.flags & 2) != 0) {
        puts("Warning: PDB file is stripped, some information might be missing or misleading.");
      }
      lVar17 = 1;
      fwrite("[      ]",8,1,_stderr);
      PDB::DBIStream::CreateImageSectionStream(&imageSectionStream,&dbiStream,&rawPdbFile);
      PDB::DBIStream::CreateModuleInfoStream(&moduleInfoStream,&dbiStream,&rawPdbFile);
      PDB::DBIStream::CreateSectionContributionStream
                (&sectionContributionStream,&dbiStream,&rawPdbFile);
      PDB::DBIStream::CreateSymbolRecordStream(&symbolRecordStream,&dbiStream,&rawPdbFile);
      contributions.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      contributions.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      contributions.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<SectionContrib,_std::allocator<SectionContrib>_>::reserve
                (&contributions,sectionContributionStream.m_count);
      std::vector<ContribInfo,_std::allocator<ContribInfo>_>::reserve
                (&to->m_Contribs,sectionContributionStream.m_count);
      auVar21._8_4_ = (int)(sectionContributionStream.m_count >> 0x20);
      auVar21._0_8_ = sectionContributionStream.m_count;
      auVar21._12_4_ = 0x45300000;
      for (lVar15 = 0; sectionContributionStream.m_count * 0x1c - lVar15 != 0;
          lVar15 = lVar15 + 0x1c) {
        if ((short)lVar17 == 0) {
          fprintf(_stderr,"\b\b\b\b\b\b\b\b[%5.1f%%]",
                  ((double)lVar17 * 10.0) /
                  ((auVar21._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sectionContributionStream.m_count) -
                  4503599627370496.0)));
        }
        uVar6 = PDB::ImageSectionStream::ConvertSectionOffsetToRVA
                          (&imageSectionStream,
                           *(uint16_t *)
                            ((long)&(sectionContributionStream.m_contributions)->section + lVar15),
                           *(uint32_t *)
                            ((long)&(sectionContributionStream.m_contributions)->offset + lVar15));
        if (uVar6 == 0) {
          fprintf(_stderr,"  Contribution (section %i, offset %i) has invalid RVA\n",
                  (ulong)*(ushort *)
                          ((long)&(sectionContributionStream.m_contributions)->section + lVar15),
                  (ulong)*(uint *)((long)&(sectionContributionStream.m_contributions)->offset +
                                  lVar15));
        }
        else {
          moduleSymbolStream.m_stream.m_size = 0;
          moduleSymbolStream.m_stream.m_ownedData._0_4_ =
               (uint)*(ushort *)
                      ((long)&(sectionContributionStream.m_contributions)->section + lVar15);
          uVar18 = *(undefined8 *)
                    ((long)&(sectionContributionStream.m_contributions)->offset + lVar15);
          moduleSymbolStream.m_stream.m_ownedData._4_4_ = (undefined4)uVar18;
          moduleSymbolStream.m_stream.m_data._0_4_ = (undefined4)((ulong)uVar18 >> 0x20);
          uVar1 = *(ushort *)
                   ((long)&(sectionContributionStream.m_contributions)->moduleIndex + lVar15);
          moduleSymbolStream.m_stream.m_data._4_4_ = (uint)uVar1;
          uVar11 = *(uint *)((long)&(sectionContributionStream.m_contributions)->characteristics +
                            lVar15);
          uVar12 = 1;
          if (((byte)uVar11 & 0xe0) == 0x20) {
LAB_00108249:
            moduleSymbolStream.m_stream.m_size = (size_t)uVar12;
          }
          else {
            uVar11 = uVar11 & 0xe0;
            if (uVar11 == 0x80) {
              uVar12 = 3;
              goto LAB_00108249;
            }
            if (uVar11 == 0x40) {
              uVar12 = 2;
              goto LAB_00108249;
            }
          }
          iVar7 = DebugInfo::GetObjectFileIndex(to,moduleInfoStream.m_modules[uVar1].m_name);
          moduleSymbolStream.m_stream.m_size =
               CONCAT44(iVar7,(undefined4)moduleSymbolStream.m_stream.m_size);
          std::vector<SectionContrib,std::allocator<SectionContrib>>::emplace_back<SectionContrib&>
                    ((vector<SectionContrib,std::allocator<SectionContrib>> *)&contributions,
                     (SectionContrib *)&moduleSymbolStream);
          rvaToSymbol._M_h._M_bucket_count =
               CONCAT44(rvaToSymbol._M_h._M_bucket_count._4_4_,
                        (undefined4)moduleSymbolStream.m_stream.m_size);
          rvaToSymbol._M_h._M_buckets =
               (__buckets_ptr)
               CONCAT44(moduleSymbolStream.m_stream.m_data._0_4_,
                        moduleSymbolStream.m_stream.m_size._4_4_);
          std::vector<ContribInfo,std::allocator<ContribInfo>>::emplace_back<ContribInfo&>
                    ((vector<ContribInfo,std::allocator<ContribInfo>> *)&to->m_Contribs,
                     (ContribInfo *)&rvaToSymbol);
        }
        lVar17 = lVar17 + 1;
      }
      rvaToSymbol._M_h._M_buckets = &rvaToSymbol._M_h._M_single_bucket;
      rvaToSymbol._M_h._M_bucket_count = 1;
      rvaToSymbol._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      rvaToSymbol._M_h._M_element_count = 0;
      rvaToSymbol._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      rvaToSymbol._M_h._M_rehash_policy._M_next_resize = 0;
      rvaToSymbol._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::__detail::
      _Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
      ::reserve((_Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
                 *)&rvaToSymbol,0x400);
      p_Var14 = &rvaToSymbol._M_h._M_before_begin;
      auVar22._8_4_ = (int)(moduleInfoStream.m_moduleCount >> 0x20);
      auVar22._0_8_ = moduleInfoStream.m_moduleCount;
      auVar22._12_4_ = 0x45300000;
      local_328 = 0;
      for (this = moduleInfoStream.m_modules;
          this != moduleInfoStream.m_modules + moduleInfoStream.m_moduleCount; this = this + 1) {
        local_328 = local_328 + 1;
        if ((local_328 & 0x7f) == 0) {
          fprintf(_stderr,"\b\b\b\b\b\b\b\b[%5.1f%%]",
                  ((double)(long)local_328 * 40.0) /
                  ((auVar22._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)moduleInfoStream.m_moduleCount) -
                  4503599627370496.0)) + 10.0);
        }
        bVar4 = PDB::ModuleInfoStream::Module::HasSymbolStream(this);
        if (bVar4) {
          PDB::ModuleInfoStream::Module::CreateSymbolStream(&moduleSymbolStream,this,&rawPdbFile);
          for (uVar13 = 4; uVar13 < moduleSymbolStream.m_stream.m_size;
              uVar13 = uVar13 + (uVar1 - 2) + 7 & 0xfffffffffffffffc) {
            uVar1 = *(ushort *)
                     (CONCAT44(moduleSymbolStream.m_stream.m_data._4_4_,
                               moduleSymbolStream.m_stream.m_data._0_4_) + uVar13);
            ProcessSymbol(&imageSectionStream,
                          (Record *)
                          (CONCAT44(moduleSymbolStream.m_stream.m_data._4_4_,
                                    moduleSymbolStream.m_stream.m_data._0_4_) + uVar13),&rvaToSymbol
                         );
          }
          PDB::CoalescedMSFStream::~CoalescedMSFStream(&moduleSymbolStream.m_stream);
        }
      }
      PDB::DBIStream::CreateGlobalSymbolStream
                ((GlobalSymbolStream *)&moduleSymbolStream,&dbiStream,&rawPdbFile);
      uVar18 = local_2d0;
      for (lVar17 = (local_2c8 & 0xffffffff) << 3; lVar17 != 0; lVar17 = lVar17 + -8) {
        pRVar8 = PDB::GlobalSymbolStream::GetRecord
                           ((GlobalSymbolStream *)&moduleSymbolStream,&symbolRecordStream,
                            (HashRecord *)uVar18);
        ProcessSymbol(&imageSectionStream,pRVar8,&rvaToSymbol);
        uVar18 = uVar18 + 8;
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)&moduleSymbolStream);
      PDB::DBIStream::CreatePublicSymbolStream
                ((PublicSymbolStream *)&moduleSymbolStream,&dbiStream,&rawPdbFile);
      for (lVar17 = (local_2c8 & 0xffffffff) << 3; lVar17 != 0; lVar17 = lVar17 + -8) {
        pRVar8 = PDB::PublicSymbolStream::GetRecord
                           ((PublicSymbolStream *)&moduleSymbolStream,&symbolRecordStream,
                            (HashRecord *)local_2d0);
        ProcessSymbol(&imageSectionStream,pRVar8,&rvaToSymbol);
        local_2d0 = local_2d0 + 8;
      }
      PDB::CoalescedMSFStream::~CoalescedMSFStream((CoalescedMSFStream *)&moduleSymbolStream);
      sVar3 = rvaToSymbol._M_h._M_element_count;
      rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::reserve
                (&rvaSortedSymbols,rvaToSymbol._M_h._M_element_count);
      while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::push_back
                  (&rvaSortedSymbols,(value_type *)(p_Var14 + 2));
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&rvaToSymbol._M_h);
      pPVar20 = rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pPVar2 = rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_start !=
          rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar15 = (long)rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar13 = lVar15 / 0x38;
        lVar17 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                  (rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar15 < 0x381) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                    (pPVar2,pPVar20);
        }
        else {
          pPVar16 = pPVar2 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Iter_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                    (pPVar2,pPVar16);
          for (; pPVar16 != pPVar20; pPVar16 = pPVar16 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<PDBSymbol*,std::vector<PDBSymbol,std::allocator<PDBSymbol>>>,__gnu_cxx::__ops::_Val_comp_iter<ReadEverything(PDB::RawFile_const&,PDB::DBIStream_const&,DebugInfo&)::__1>>
                      (pPVar16);
          }
        }
      }
      if (sVar3 != 0) {
        PDB::CreateTPIStream((TPIStream *)&moduleSymbolStream,&rawPdbFile);
        TypeTable::TypeTable(&typeTable,(TPIStream *)&moduleSymbolStream);
        typeSizeCache._M_h._M_buckets = &typeSizeCache._M_h._M_single_bucket;
        typeSizeCache._M_h._M_bucket_count = 1;
        typeSizeCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        typeSizeCache._M_h._M_element_count = 0;
        typeSizeCache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        typeSizeCache._M_h._M_rehash_policy._M_next_resize = 0;
        typeSizeCache._M_h._M_single_bucket = (__node_base_ptr)0x0;
        lVar17 = 0x30;
        sVar19 = sVar3;
        while (pPVar2 = rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                        _M_impl.super__Vector_impl_data._M_start, sVar19 != 0) {
          if (*(int *)((long)rvaSortedSymbols.
                             super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar17 + -0xc) == 0) {
            if (*(int *)((long)&((rvaSortedSymbols.
                                  super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                                  super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar17
                        ) != 0) {
              __k = (key_type *)
                    ((long)&((rvaSortedSymbols.
                              super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
                              super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar17);
              std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&typeSizeCache._M_h,__k);
              sVar9 = PDBGetTypeSize(&typeTable,*__k);
              local_1c0[0] = *__k;
              local_1b8 = sVar9;
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_int_const,unsigned_long>>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&typeSizeCache,local_1c0);
              if (sVar9 != 0) {
                *(int *)((long)pPVar2 + lVar17 + -0xc) = (int)sVar9;
              }
            }
            pSVar10 = ContribFromSectionOffset
                                (contributions.
                                 super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 ((long)contributions.
                                        super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)contributions.
                                       super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                                 *(uint32_t *)((long)pPVar2 + lVar17 + -8),
                                 *(uint32_t *)((long)pPVar2 + lVar17 + -4));
            if ((pSVar10 != (SectionContrib *)0x0) &&
               (pSVar10->Length <= *(int *)((long)pPVar2 + lVar17 + -0xc) - 1U)) {
              *(uint32_t *)((long)pPVar2 + lVar17 + -0xc) = pSVar10->Length;
            }
            if (((sVar19 != 1) &&
                (uVar11 = *(int *)((long)&(rvaSortedSymbols.
                                           super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->section +
                                  lVar17) - *(int *)((long)pPVar2 + lVar17 + -0x10), uVar11 != 0))
               && (uVar11 <= *(int *)((long)pPVar2 + lVar17 + -0xc) - 1U)) {
              *(uint *)((long)pPVar2 + lVar17 + -0xc) = uVar11;
            }
          }
          lVar17 = lVar17 + 0x38;
          sVar19 = sVar19 - 1;
        }
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&typeSizeCache._M_h);
        TypeTable::~TypeTable(&typeTable);
      }
      pPVar2 = rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>._M_impl.
               super__Vector_impl_data._M_finish;
      auVar23._8_4_ = (int)(sVar3 >> 0x20);
      auVar23._0_8_ = sVar3;
      auVar23._12_4_ = 0x45300000;
      lVar17 = 1;
      for (pPVar20 = rvaSortedSymbols.super__Vector_base<PDBSymbol,_std::allocator<PDBSymbol>_>.
                     _M_impl.super__Vector_impl_data._M_start; pPVar20 != pPVar2;
          pPVar20 = pPVar20 + 1) {
        if ((short)lVar17 == 0) {
          auVar24._8_4_ = (int)((ulong)lVar17 >> 0x20);
          auVar24._0_8_ = lVar17;
          auVar24._12_4_ = 0x45300000;
          fprintf(_stderr,"\b\b\b\b\b\b\b\b[%5.1f%%]",
                  (((auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) * 50.0) /
                  ((auVar23._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) + 50.0);
        }
        ContribFromSectionOffset
                  (contributions.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   ((long)contributions.
                          super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)contributions.
                         super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>._M_impl
                         .super__Vector_impl_data._M_start) / 0x18,pPVar20->section,pPVar20->offset)
        ;
        moduleSymbolStream.m_stream.m_ownedData = (Byte *)&moduleSymbolStream.m_stream.m_size;
        moduleSymbolStream.m_stream.m_data._0_4_ = 0;
        moduleSymbolStream.m_stream.m_data._4_4_ = 0;
        moduleSymbolStream.m_stream.m_size = moduleSymbolStream.m_stream.m_size & 0xffffffffffffff00
        ;
        if ((pPVar20->name)._M_string_length == 0) {
          std::__cxx11::string::string((string *)&typeSizeCache,"<noname>",(allocator *)&typeTable);
        }
        else {
          std::__cxx11::string::string((string *)&typeSizeCache,(string *)pPVar20);
        }
        std::__cxx11::string::_M_assign((string *)&moduleSymbolStream);
        std::__cxx11::string::~string((string *)&typeSizeCache);
        DebugInfo::GetNameSpaceIndex(to,&pPVar20->name);
        std::vector<SymbolInfo,std::allocator<SymbolInfo>>::emplace_back<SymbolInfo&>
                  ((vector<SymbolInfo,std::allocator<SymbolInfo>> *)to,
                   (SymbolInfo *)&moduleSymbolStream);
        std::__cxx11::string::~string((string *)&moduleSymbolStream);
        lVar17 = lVar17 + 1;
      }
      std::vector<PDBSymbol,_std::allocator<PDBSymbol>_>::~vector(&rvaSortedSymbols);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_PDBSymbol>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&rvaToSymbol._M_h);
      std::_Vector_base<SectionContrib,_std::allocator<SectionContrib>_>::~_Vector_base
                (&contributions.super__Vector_base<SectionContrib,_std::allocator<SectionContrib>_>)
      ;
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&symbolRecordStream);
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&sectionContributionStream.m_stream);
      PDB::ModuleInfoStream::~ModuleInfoStream(&moduleInfoStream);
      PDB::CoalescedMSFStream::~CoalescedMSFStream(&imageSectionStream.m_stream);
      bVar4 = true;
    }
    PDB::CoalescedMSFStream::~CoalescedMSFStream(&infoStream.m_stream);
  }
  else {
    bVar4 = false;
    fprintf(_stderr,"  PDB file \'%s\' does not have valid DBI stream, error code %i\n",fileName,
            (ulong)EVar5);
  }
  PDB::RawFile::~RawFile(&rawPdbFile);
LAB_00108344:
  MemoryMappedFile::~MemoryMappedFile(&pdbFile);
  return bVar4;
}

Assistant:

bool ReadDebugInfo(const char *fileName, DebugInfo &to)
{
    // open the PDB file
    MemoryMappedFile pdbFile(fileName);
    if (pdbFile.baseAddress == nullptr)
    {
        fprintf(stderr, "  failed to memory-map PDB file '%s'\n", fileName);
        return false;
    }
    PDB::ErrorCode errorCode = PDB::ValidateFile(pdbFile.baseAddress);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  failed to validate PDB file '%s': error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::RawFile rawPdbFile = PDB::CreateRawFile(pdbFile.baseAddress);
    errorCode = PDB::HasValidDBIStream(rawPdbFile);
    if (errorCode != PDB::ErrorCode::Success)
    {
        fprintf(stderr, "  PDB file '%s' does not have valid DBI stream, error code %i\n", fileName, (int)errorCode);
        return false;
    }
    const PDB::InfoStream infoStream(rawPdbFile);
    if (infoStream.UsesDebugFastLink())
    {
        fprintf(stderr, "  PDB file '%s' uses unsupported option /DEBUG:FASTLINK\n", fileName);
        return false;
    }
    const PDB::DBIStream dbiStream = PDB::CreateDBIStream(rawPdbFile);
    if (!HasValidDBIStreams(rawPdbFile, dbiStream))
    {
        fprintf(stderr, "  PDB file '%s' does not have required DBI sections\n", fileName);
        return false;
    }

    if (dbiStream.GetHeader().flags & 0x1)
    {
        printf("Warning: PDB file is created with incremental linking, some information might be misleading.\n");
    }
    if (dbiStream.GetHeader().flags & 0x2)
    {
        printf("Warning: PDB file is stripped, some information might be missing or misleading.\n");
    }

    ReadEverything(rawPdbFile, dbiStream, to);

    return true;
}